

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O3

bool __thiscall
gmlc::concurrency::
SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
::checkObjectType(SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                  *this,string *name,char type)

{
  _Base_ptr p_Var1;
  int iVar2;
  const_iterator cVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
          ::find(&(this->typeMap)._M_t,name);
  if ((_Rb_tree_header *)cVar3._M_node != &(this->typeMap)._M_t._M_impl.super__Rb_tree_header) {
    p_Var1 = *(_Base_ptr *)(cVar3._M_node + 2);
    if (p_Var1 != cVar3._M_node[2]._M_parent) {
      do {
        p_Var4 = (_Base_ptr)((long)&p_Var1->_M_color + 1);
        bVar5 = (char)p_Var1->_M_color == type;
        if (bVar5) break;
        p_Var1 = p_Var4;
      } while (p_Var4 != cVar3._M_node[2]._M_parent);
      goto LAB_00112c6d;
    }
  }
  bVar5 = false;
LAB_00112c6d:
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return bVar5;
}

Assistant:

bool checkObjectType(const std::string& name, Y type) const
    {
        std::lock_guard<std::mutex> lock(mapLock);
        auto fnd = typeMap.find(name);
        if (fnd != typeMap.end()) {
            for (auto& stype : fnd->second) {
                if (stype == type) {
                    return true;
                }
            }
        }
        return false;
    }